

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int runC(lua_State *L,lua_State *L1,char *pc)

{
  char cVar1;
  undefined1 auVar2 [16];
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  lua_CFunction p_Var8;
  char *r;
  size_t sVar9;
  ulong uVar10;
  void *pvVar11;
  char *pcVar12;
  char *pcVar13;
  lua_State *plVar14;
  lua_State *to;
  code *pcVar15;
  lua_KContext lVar16;
  bool bVar17;
  undefined8 uVar19;
  undefined1 auVar18 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM1_Qb;
  char buff [300];
  int local_174;
  char *local_170;
  char local_168;
  char cStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  char cStack_164;
  undefined1 uStack_163;
  undefined1 uStack_162;
  undefined1 uStack_161;
  char local_160;
  undefined1 uStack_15f;
  undefined1 uStack_15e;
  undefined1 uStack_15d;
  undefined4 uStack_15c;
  char local_158;
  
  local_170 = pc;
  if (pc == (char *)0x0) {
    iVar7 = luaL_error(L,"attempt to runC null script");
    return iVar7;
  }
  getstring_aux(L,&local_168,&local_170);
  if (local_168 != '\0') {
    local_174 = 0;
    do {
      auVar18 = in_ZMM0._0_16_;
      uVar19 = in_ZMM0._8_8_;
      if (local_160 == '\0' &&
          CONCAT17(uStack_161,
                   CONCAT16(uStack_162,
                            CONCAT15(uStack_163,
                                     CONCAT14(cStack_164,
                                              CONCAT13(uStack_165,
                                                       CONCAT12(uStack_166,
                                                                CONCAT11(cStack_167,local_168)))))))
          == 0x7865646e69736261) {
        iVar7 = getindex_aux(L,L1,&local_170);
        iVar7 = lua_absindex(L1,iVar7);
        auVar18._0_8_ = (double)iVar7;
        auVar18._8_8_ = in_XMM1_Qb;
LAB_0014e50d:
        in_ZMM0 = ZEXT1664(auVar18);
        lua_pushnumber(L1,auVar18._0_8_);
      }
      else if (CONCAT13(uStack_162,CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) == 0x646e65
               && CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                  0x65707061) {
        iVar7 = getindex_aux(L,L1,&local_170);
        sVar9 = lua_rawlen(L1,iVar7);
        lua_rawseti(L1,iVar7,(long)((int)sVar9 + 1));
      }
      else if (CONCAT11(uStack_163,cStack_164) == 0x68 &&
               CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
               0x74697261) {
        skip(&local_170);
        cVar1 = *local_170;
        local_170 = local_170 + 1;
        pvVar11 = memchr("+-*%^/\\&|~<>_!",(int)cVar1,0xf);
        lua_arith(L1,(int)pvVar11 + -0x167d78);
      }
      else if (cStack_164 == '\0' &&
               CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
               0x6c6c6163) {
        iVar7 = getnum_aux(L,L1,&local_170);
        iVar4 = getnum_aux(L,L1,&local_170);
        lua_callk(L1,iVar7,iVar4,0,(lua_KFunction)0x0);
      }
      else if (CONCAT11(uStack_163,cStack_164) == 0x6b &&
               CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
               0x6c6c6163) {
        iVar7 = getnum_aux(L,L1,&local_170);
        iVar4 = getnum_aux(L,L1,&local_170);
        iVar5 = getindex_aux(L,L1,&local_170);
        lua_callk(L1,iVar7,iVar4,(long)iVar5,Cfunck);
      }
      else if (CONCAT17(uStack_15e,
                        CONCAT16(uStack_15f,
                                 CONCAT15(local_160,
                                          CONCAT14(uStack_161,
                                                   CONCAT13(uStack_162,
                                                            CONCAT12(uStack_163,
                                                                     CONCAT11(cStack_164,uStack_165)
                                                                    )))))) == 0x6b636174736b63 &&
               CONCAT17(uStack_161,
                        CONCAT16(uStack_162,
                                 CONCAT15(uStack_163,
                                          CONCAT14(cStack_164,
                                                   CONCAT13(uStack_165,
                                                            CONCAT12(uStack_166,
                                                                     CONCAT11(cStack_167,local_168))
                                                           ))))) == 0x6174736b63656863) {
        iVar7 = getnum_aux(L,L1,&local_170);
        getstring_aux(L,&local_168,&local_170);
        pcVar13 = (char *)0x0;
        if (local_168 != '\0') {
          pcVar13 = &local_168;
        }
        luaL_checkstack(L1,iVar7,pcVar13);
      }
      else {
        iVar7 = CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)));
        lVar3 = CONCAT17(uStack_161,
                         CONCAT16(uStack_162,CONCAT15(uStack_163,CONCAT14(cStack_164,iVar7))));
        if (lVar3 == 0x657261706d6f63) {
          getstring_aux(L,&local_168,&local_170);
          iVar7 = (cStack_167 != 'T') + 1;
          if (local_168 == 'E') {
            iVar7 = 0;
          }
          iVar4 = getindex_aux(L,L1,&local_170);
          iVar5 = getindex_aux(L,L1,&local_170);
          uVar6 = lua_compare(L1,iVar4,iVar5,iVar7);
          goto LAB_0014e4e7;
        }
        if (CONCAT13(uStack_162,CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) == 0x746163 &&
            CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) == 0x636e6f63)
        {
          iVar7 = getnum_aux(L,L1,&local_170);
          lua_concat(L1,iVar7);
        }
        else if (cStack_164 == '\0' &&
                 CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                 0x79706f63) {
          iVar7 = getindex_aux(L,L1,&local_170);
          iVar4 = getindex_aux(L,L1,&local_170);
          lua_copy(L1,iVar7,iVar4);
        }
        else {
          if (local_160 == '\0' &&
              CONCAT17(uStack_161,
                       CONCAT16(uStack_162,
                                CONCAT15(uStack_163,
                                         CONCAT14(cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                 )))) == 0x6d756e32636e7566) {
            iVar7 = getindex_aux(L,L1,&local_170);
            p_Var8 = lua_tocfunction(L1,iVar7);
            auVar2._8_8_ = in_XMM1_Qb;
            auVar2._0_8_ = in_XMM1_Qa;
            auVar18 = vcvtusi2sd_avx512f(auVar2,p_Var8);
            goto LAB_0014e50d;
          }
          if (local_160 == '\0' &&
              CONCAT17(uStack_161,
                       CONCAT16(uStack_162,
                                CONCAT15(uStack_163,
                                         CONCAT14(cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                 )))) == 0x646c656966746567) {
            iVar7 = getindex_aux(L,L1,&local_170);
            getstring_aux(L,&local_168,&local_170);
            lua_getfield(L1,iVar7,&local_168);
          }
          else if (CONCAT11(uStack_15f,local_160) == 0x6c &&
                   CONCAT17(uStack_161,
                            CONCAT16(uStack_162,
                                     CONCAT15(uStack_163,
                                              CONCAT14(cStack_164,
                                                       CONCAT13(uStack_165,
                                                                CONCAT12(uStack_166,
                                                                         CONCAT11(cStack_167,
                                                                                  local_168)))))))
                   == 0x61626f6c67746567) {
            getstring_aux(L,&local_168,&local_170);
            lua_getglobal(L1,&local_168);
          }
          else if (CONCAT17((undefined1)uStack_15c,
                            CONCAT16(uStack_15d,
                                     CONCAT15(uStack_15e,
                                              CONCAT14(uStack_15f,
                                                       CONCAT13(local_160,
                                                                CONCAT12(uStack_161,
                                                                         CONCAT11(uStack_162,
                                                                                  uStack_163)))))))
                   == 0x656c6261746174 &&
                   CONCAT17(uStack_161,
                            CONCAT16(uStack_162,
                                     CONCAT15(uStack_163,
                                              CONCAT14(cStack_164,
                                                       CONCAT13(uStack_165,
                                                                CONCAT12(uStack_166,
                                                                         CONCAT11(cStack_167,
                                                                                  local_168)))))))
                   == 0x746174656d746567) {
            iVar7 = getindex_aux(L,L1,&local_170);
            iVar7 = lua_getmetatable(L1,iVar7);
            if (iVar7 == 0) {
              lua_pushnil(L1);
            }
          }
          else if (local_160 == '\0' &&
                   CONCAT17(uStack_161,
                            CONCAT16(uStack_162,
                                     CONCAT15(uStack_163,
                                              CONCAT14(cStack_164,
                                                       CONCAT13(uStack_165,
                                                                CONCAT12(uStack_166,
                                                                         CONCAT11(cStack_167,
                                                                                  local_168)))))))
                   == 0x656c626174746567) {
            iVar7 = getindex_aux(L,L1,&local_170);
            lua_gettable(L1,iVar7);
          }
          else if (CONCAT13(uStack_162,CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) ==
                   0x706f74 &&
                   CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                   0x74746567) {
            iVar7 = lua_gettop(L1);
            lua_pushinteger(L1,(long)iVar7);
          }
          else if (cStack_164 == '\0' &&
                   CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                   0x62757367) {
            iVar7 = getnum_aux(L,L1,&local_170);
            iVar4 = getnum_aux(L,L1,&local_170);
            iVar5 = getnum_aux(L,L1,&local_170);
            pcVar13 = lua_tolstring(L1,iVar7,(size_t *)0x0);
            pcVar12 = lua_tolstring(L1,iVar4,(size_t *)0x0);
            r = lua_tolstring(L1,iVar5,(size_t *)0x0);
            luaL_gsub(L1,pcVar13,pcVar12,r);
          }
          else if (CONCAT13(uStack_162,CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) ==
                   0x747265 &&
                   CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                   0x65736e69) {
            iVar7 = getnum_aux(L,L1,&local_170);
            lua_rotate(L1,iVar7,1);
          }
          else {
            if (CONCAT13(uStack_15d,CONCAT12(uStack_15e,CONCAT11(uStack_15f,local_160))) == 0x6e6f69
                && CONCAT17(uStack_161,
                            CONCAT16(uStack_162,
                                     CONCAT15(uStack_163,
                                              CONCAT14(cStack_164,
                                                       CONCAT13(uStack_165,
                                                                CONCAT12(uStack_166,
                                                                         CONCAT11(cStack_167,
                                                                                  local_168)))))))
                   == 0x74636e7566637369) {
              iVar7 = getindex_aux(L,L1,&local_170);
              uVar6 = lua_iscfunction(L1,iVar7);
              goto LAB_0014eaf8;
            }
            if (CONCAT17(uStack_15e,
                         CONCAT16(uStack_15f,
                                  CONCAT15(local_160,
                                           CONCAT14(uStack_161,
                                                    CONCAT13(uStack_162,
                                                             CONCAT12(uStack_163,
                                                                      CONCAT11(cStack_164,uStack_165
                                                                              ))))))) ==
                0x6e6f6974636e75 &&
                CONCAT17(uStack_161,
                         CONCAT16(uStack_162,
                                  CONCAT15(uStack_163,
                                           CONCAT14(cStack_164,
                                                    CONCAT13(uStack_165,
                                                             CONCAT12(uStack_166,
                                                                      CONCAT11(cStack_167,local_168)
                                                                     )))))) == 0x6974636e75667369) {
              iVar7 = getindex_aux(L,L1,&local_170);
              iVar7 = lua_type(L1,iVar7);
              bVar17 = iVar7 == 6;
LAB_0014eaf1:
              uVar6 = (uint)bVar17;
            }
            else {
              if (CONCAT11(uStack_163,cStack_164) == 0x6c &&
                  CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                  0x696e7369) {
                iVar7 = getindex_aux(L,L1,&local_170);
                iVar7 = lua_type(L1,iVar7);
                bVar17 = iVar7 == 0;
                goto LAB_0014eaf1;
              }
              if (CONCAT13(uStack_162,CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) ==
                  0x6c6c75 &&
                  CONCAT13(uStack_165,CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                  0x756e7369) {
                iVar7 = getindex_aux(L,L1,&local_170);
                iVar7 = lua_type(L1,iVar7);
                bVar17 = iVar7 == -1;
                goto LAB_0014eaf1;
              }
              if (local_160 == '\0' &&
                  CONCAT17(uStack_161,
                           CONCAT16(uStack_162,
                                    CONCAT15(uStack_163,
                                             CONCAT14(cStack_164,
                                                      CONCAT13(uStack_165,
                                                               CONCAT12(uStack_166,
                                                                        CONCAT11(cStack_167,
                                                                                 local_168))))))) ==
                  0x7265626d756e7369) {
                iVar7 = getindex_aux(L,L1,&local_170);
                uVar6 = lua_isnumber(L1,iVar7);
              }
              else {
                if (local_160 != '\0' ||
                    CONCAT17(uStack_161,
                             CONCAT16(uStack_162,
                                      CONCAT15(uStack_163,
                                               CONCAT14(cStack_164,
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168)))))))
                    != 0x676e697274737369) {
                  if (lVar3 == 0x656c6261747369) {
                    iVar7 = getindex_aux(L,L1,&local_170);
                    iVar7 = lua_type(L1,iVar7);
                    bVar17 = iVar7 == 5;
                  }
                  else {
                    if (CONCAT17(uStack_15e,
                                 CONCAT16(uStack_15f,
                                          CONCAT15(local_160,
                                                   CONCAT14(uStack_161,
                                                            CONCAT13(uStack_162,
                                                                     CONCAT12(uStack_163,
                                                                              CONCAT11(cStack_164,
                                                                                       uStack_165)))
                                                           )))) != 0x6c617661746164 ||
                        CONCAT17(uStack_161,
                                 CONCAT16(uStack_162,
                                          CONCAT15(uStack_163,
                                                   CONCAT14(cStack_164,
                                                            CONCAT13(uStack_165,
                                                                     CONCAT12(uStack_166,
                                                                              CONCAT11(cStack_167,
                                                                                       local_168))))
                                                  ))) != 0x7661746164757369) {
                      if (CONCAT17(uStack_15e,
                                   CONCAT16(uStack_15f,
                                            CONCAT15(local_160,
                                                     CONCAT14(uStack_161,
                                                              CONCAT13(uStack_162,
                                                                       CONCAT12(uStack_163,
                                                                                CONCAT11(cStack_164,
                                                                                         uStack_165)
                                                                               )))))) ==
                          0x61746164726573 &&
                          CONCAT17(uStack_161,
                                   CONCAT16(uStack_162,
                                            CONCAT15(uStack_163,
                                                     CONCAT14(cStack_164,
                                                              CONCAT13(uStack_165,
                                                                       CONCAT12(uStack_166,
                                                                                CONCAT11(cStack_167,
                                                                                         local_168))
                                                                      ))))) == 0x6164726573757369) {
                        iVar7 = getindex_aux(L,L1,&local_170);
                        uVar6 = lua_isuserdata(L1,iVar7);
                        goto LAB_0014e4e7;
                      }
                      if (iVar7 == 0x6e656c) {
                        iVar7 = getindex_aux(L,L1,&local_170);
                        lua_len(L1,iVar7);
                      }
                      else if (cStack_164 == '\0' &&
                               CONCAT13(uStack_165,
                                        CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                               0x6e656c4c) {
                        iVar7 = getindex_aux(L,L1,&local_170);
                        sVar9 = luaL_len(L1,iVar7);
LAB_0014ed58:
                        lua_pushinteger(L1,sVar9);
                      }
                      else if (local_160 == '\0' &&
                               CONCAT17(uStack_161,
                                        CONCAT16(uStack_162,
                                                 CONCAT15(uStack_163,
                                                          CONCAT14(cStack_164,
                                                                   CONCAT13(uStack_165,
                                                                            CONCAT12(uStack_166,
                                                                                     CONCAT11(
                                                  cStack_167,local_168))))))) == 0x656c696664616f6c)
                      {
                        iVar7 = getnum_aux(L,L1,&local_170);
                        pcVar13 = luaL_checklstring(L1,iVar7,(size_t *)0x0);
                        luaL_loadfilex(L1,pcVar13,(char *)0x0);
                      }
                      else if (CONCAT17(uStack_15e,
                                        CONCAT16(uStack_15f,
                                                 CONCAT15(local_160,
                                                          CONCAT14(uStack_161,
                                                                   CONCAT13(uStack_162,
                                                                            CONCAT12(uStack_163,
                                                                                     CONCAT11(
                                                  cStack_164,uStack_165))))))) == 0x676e6972747364
                               && CONCAT17(uStack_161,
                                           CONCAT16(uStack_162,
                                                    CONCAT15(uStack_163,
                                                             CONCAT14(cStack_164,
                                                                      CONCAT13(uStack_165,
                                                                               CONCAT12(uStack_166,
                                                                                        CONCAT11(
                                                  cStack_167,local_168))))))) == 0x6972747364616f6c)
                      {
                        iVar7 = getnum_aux(L,L1,&local_170);
                        pcVar13 = luaL_checklstring(L1,iVar7,(size_t *)0x0);
                        luaL_loadstring(L1,pcVar13);
                      }
                      else {
                        if (CONCAT17((undefined1)uStack_15c,
                                     CONCAT16(uStack_15d,
                                              CONCAT15(uStack_15e,
                                                       CONCAT14(uStack_15f,
                                                                CONCAT13(local_160,
                                                                         CONCAT12(uStack_161,
                                                                                  CONCAT11(
                                                  uStack_162,uStack_163))))))) == 0x656c6261746174
                            && CONCAT17(uStack_161,
                                        CONCAT16(uStack_162,
                                                 CONCAT15(uStack_163,
                                                          CONCAT14(cStack_164,
                                                                   CONCAT13(uStack_165,
                                                                            CONCAT12(uStack_166,
                                                                                     CONCAT11(
                                                  cStack_167,local_168))))))) == 0x746174656d77656e)
                        {
                          getstring_aux(L,&local_168,&local_170);
                          uVar6 = luaL_newmetatable(L1,&local_168);
                          goto LAB_0014e4e7;
                        }
                        if (local_160 == '\0' &&
                            CONCAT17(uStack_161,
                                     CONCAT16(uStack_162,
                                              CONCAT15(uStack_163,
                                                       CONCAT14(cStack_164,
                                                                CONCAT13(uStack_165,
                                                                         CONCAT12(uStack_166,
                                                                                  CONCAT11(
                                                  cStack_167,local_168))))))) == 0x656c62617477656e)
                        {
                          lua_createtable(L1,0,0);
                        }
                        else if (CONCAT11(uStack_15f,local_160) == 100 &&
                                 CONCAT17(uStack_161,
                                          CONCAT16(uStack_162,
                                                   CONCAT15(uStack_163,
                                                            CONCAT14(cStack_164,
                                                                     CONCAT13(uStack_165,
                                                                              CONCAT12(uStack_166,
                                                                                       CONCAT11(
                                                  cStack_167,local_168))))))) == 0x616572687477656e)
                        {
                          lua_newthread(L1);
                        }
                        else if (CONCAT13(uStack_15d,
                                          CONCAT12(uStack_15e,CONCAT11(uStack_15f,local_160))) ==
                                 0x617461 &&
                                 CONCAT17(uStack_161,
                                          CONCAT16(uStack_162,
                                                   CONCAT15(uStack_163,
                                                            CONCAT14(cStack_164,
                                                                     CONCAT13(uStack_165,
                                                                              CONCAT12(uStack_166,
                                                                                       CONCAT11(
                                                  cStack_167,local_168))))))) == 0x647265737577656e)
                        {
                          iVar7 = getnum_aux(L,L1,&local_170);
                          lua_newuserdata(L1,(long)iVar7);
                        }
                        else if (cStack_164 == '\0' &&
                                 CONCAT13(uStack_165,
                                          CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                                 0x7478656e) {
                          lua_next(L1,-2);
                        }
                        else {
                          if (lVar3 == 0x657a69736a626f) {
                            iVar7 = getindex_aux(L,L1,&local_170);
                            sVar9 = lua_rawlen(L1,iVar7);
                            goto LAB_0014ed58;
                          }
                          if (CONCAT11(uStack_163,cStack_164) == 0x6c &&
                              CONCAT13(uStack_165,
                                       CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) ==
                              0x6c616370) {
                            iVar5 = getnum_aux(L,L1,&local_170);
                            iVar4 = getnum_aux(L,L1,&local_170);
                            iVar7 = getnum_aux(L,L1,&local_170);
                            lVar16 = 0;
                            pcVar15 = (lua_KFunction)0x0;
                          }
                          else {
                            if (CONCAT13(uStack_162,
                                         CONCAT12(uStack_163,CONCAT11(cStack_164,uStack_165))) !=
                                0x6b6c6c ||
                                CONCAT13(uStack_165,
                                         CONCAT12(uStack_166,CONCAT11(cStack_167,local_168))) !=
                                0x6c616370) {
                              if (iVar7 == 0x706f70) {
                                uVar6 = getnum_aux(L,L1,&local_170);
                                uVar6 = ~uVar6;
LAB_0014ee75:
                                lua_settop(L1,uVar6);
                              }
                              else if (CONCAT17(uStack_15e,
                                                CONCAT16(uStack_15f,
                                                         CONCAT15(local_160,
                                                                  CONCAT14(uStack_161,
                                                                           CONCAT13(uStack_162,
                                                                                    CONCAT12(
                                                  uStack_163,CONCAT11(cStack_164,uStack_165)))))))
                                       == 0x6b63617473746e &&
                                       CONCAT17(uStack_161,
                                                CONCAT16(uStack_162,
                                                         CONCAT15(uStack_163,
                                                                  CONCAT14(cStack_164,
                                                                           CONCAT13(uStack_165,
                                                                                    CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                       0x617473746e697270) {
                                iVar7 = getnum_aux(L,L1,&local_170);
                                if (iVar7 != 0) {
                                  pcVar13 = luaL_tolstring(L1,iVar7,(size_t *)0x0);
                                  puts(pcVar13);
                                  goto LAB_0014f022;
                                }
                                printstack(L1);
                              }
                              else if (CONCAT11(uStack_163,cStack_164) == 0x74 &&
                                       CONCAT13(uStack_165,
                                                CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)))
                                       == 0x6e697270) {
                                getstring_aux(L,&local_168,&local_170);
                                puts(&local_168);
                              }
                              else {
                                if (local_160 == '\0' &&
                                    CONCAT17(uStack_161,
                                             CONCAT16(uStack_162,
                                                      CONCAT15(uStack_163,
                                                               CONCAT14(cStack_164,
                                                                        CONCAT13(uStack_165,
                                                                                 CONCAT12(uStack_166
                                                                                          ,CONCAT11(
                                                  cStack_167,local_168))))))) == 0x6c6f6f6268737570)
                                {
                                  uVar6 = getnum_aux(L,L1,&local_170);
                                  goto LAB_0014e4e7;
                                }
                                if (CONCAT17((undefined1)uStack_15c,
                                             CONCAT16(uStack_15d,
                                                      CONCAT15(uStack_15e,
                                                               CONCAT14(uStack_15f,
                                                                        CONCAT13(local_160,
                                                                                 CONCAT12(uStack_161
                                                                                          ,CONCAT11(
                                                  uStack_162,uStack_163))))))) == 0x657275736f6c63
                                    && CONCAT17(uStack_161,
                                                CONCAT16(uStack_162,
                                                         CONCAT15(uStack_163,
                                                                  CONCAT14(cStack_164,
                                                                           CONCAT13(uStack_165,
                                                                                    CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                       0x6f6c636368737570) {
                                  iVar7 = getnum_aux(L,L1,&local_170);
                                  pcVar15 = testC;
LAB_0014f081:
                                  lua_pushcclosure(L1,pcVar15,iVar7);
                                }
                                else if (lVar3 == 0x6c696e68737570) {
                                  lua_pushnil(L1);
                                }
                                else {
                                  if (lVar3 == 0x6d756e68737570) {
                                    iVar7 = getnum_aux(L,L1,&local_170);
                                    in_ZMM0 = ZEXT1664(CONCAT88(uVar19,(double)iVar7));
                                    goto LAB_0014f0aa;
                                  }
                                  if (lVar3 == 0x746e6968737570) {
                                    iVar7 = getnum_aux(L,L1,&local_170);
LAB_0014eff4:
                                    sVar9 = (size_t)iVar7;
                                    goto LAB_0014ed58;
                                  }
                                  if (CONCAT17(uStack_15e,
                                               CONCAT16(uStack_15f,
                                                        CONCAT15(local_160,
                                                                 CONCAT14(uStack_161,
                                                                          CONCAT13(uStack_162,
                                                                                   CONCAT12(
                                                  uStack_163,CONCAT11(cStack_164,uStack_165)))))))
                                      == 0x73757461747368 &&
                                      CONCAT17(uStack_161,
                                               CONCAT16(uStack_162,
                                                        CONCAT15(uStack_163,
                                                                 CONCAT14(cStack_164,
                                                                          CONCAT13(uStack_165,
                                                                                   CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                      0x7461747368737570) {
                                    pcVar13 = *(char **)(pushcode_codes + (long)local_174 * 8);
                                  }
                                  else {
                                    if (CONCAT17(uStack_15e,
                                                 CONCAT16(uStack_15f,
                                                          CONCAT15(local_160,
                                                                   CONCAT14(uStack_161,
                                                                            CONCAT13(uStack_162,
                                                                                     CONCAT12(
                                                  uStack_163,CONCAT11(cStack_164,uStack_165)))))))
                                        != 0x676e6972747368 ||
                                        CONCAT17(uStack_161,
                                                 CONCAT16(uStack_162,
                                                          CONCAT15(uStack_163,
                                                                   CONCAT14(cStack_164,
                                                                            CONCAT13(uStack_165,
                                                                                     CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) !=
                                        0x6972747368737570) {
                                      if ((local_158 == '\0' &&
                                          CONCAT17(uStack_161,
                                                   CONCAT16(uStack_162,
                                                            CONCAT15(uStack_163,
                                                                     CONCAT14(cStack_164,
                                                                              CONCAT13(uStack_165,
                                                                                       CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                          0x6176707568737570) &&
                                          CONCAT44(uStack_15c,
                                                   CONCAT13(uStack_15d,
                                                            CONCAT12(uStack_15e,
                                                                     CONCAT11(uStack_15f,local_160))
                                                           )) == 0x7865646e6965756c) {
                                        iVar7 = getnum_aux(L,L1,&local_170);
                                        iVar7 = -0xf4628 - iVar7;
                                        goto LAB_0014eff4;
                                      }
                                      if (CONCAT11(uStack_15f,local_160) == 0x65 &&
                                          CONCAT17(uStack_161,
                                                   CONCAT16(uStack_162,
                                                            CONCAT15(uStack_163,
                                                                     CONCAT14(cStack_164,
                                                                              CONCAT13(uStack_165,
                                                                                       CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                          0x756c617668737570) {
                                        iVar7 = getindex_aux(L,L1,&local_170);
                                        lua_pushvalue(L1,iVar7);
                                      }
                                      else if (CONCAT17((undefined1)uStack_15c,
                                                        CONCAT16(uStack_15d,
                                                                 CONCAT15(uStack_15e,
                                                                          CONCAT14(uStack_15f,
                                                                                   CONCAT13(
                                                  local_160,
                                                  CONCAT12(uStack_161,
                                                           CONCAT11(uStack_162,uStack_163))))))) ==
                                               0x49676e69727473 &&
                                               CONCAT17(uStack_161,
                                                        CONCAT16(uStack_162,
                                                                 CONCAT15(uStack_163,
                                                                          CONCAT14(cStack_164,
                                                                                   CONCAT13(
                                                  uStack_165,
                                                  CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)
                                                          )))))) == 0x7274736668737570) {
                                        pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                        uVar10 = lua_tointegerx(L,-1,(int *)0x0);
                                        lua_pushfstring(L1,pcVar13,uVar10 & 0xffffffff);
                                      }
                                      else {
                                        if (CONCAT17((undefined1)uStack_15c,
                                                     CONCAT16(uStack_15d,
                                                              CONCAT15(uStack_15e,
                                                                       CONCAT14(uStack_15f,
                                                                                CONCAT13(local_160,
                                                                                         CONCAT12(
                                                  uStack_161,CONCAT11(uStack_162,uStack_163)))))))
                                            == 0x53676e69727473 &&
                                            CONCAT17(uStack_161,
                                                     CONCAT16(uStack_162,
                                                              CONCAT15(uStack_163,
                                                                       CONCAT14(cStack_164,
                                                                                CONCAT13(uStack_165,
                                                                                         CONCAT12(
                                                  uStack_166,CONCAT11(cStack_167,local_168))))))) ==
                                            0x7274736668737570) {
                                          pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                          pcVar12 = lua_tolstring(L,-1,(size_t *)0x0);
                                        }
                                        else {
                                          if (CONCAT17((undefined1)uStack_15c,
                                                       CONCAT16(uStack_15d,
                                                                CONCAT15(uStack_15e,
                                                                         CONCAT14(uStack_15f,
                                                                                  CONCAT13(local_160
                                                  ,CONCAT12(uStack_161,
                                                            CONCAT11(uStack_162,uStack_163))))))) !=
                                              0x50676e69727473 ||
                                              CONCAT17(uStack_161,
                                                       CONCAT16(uStack_162,
                                                                CONCAT15(uStack_163,
                                                                         CONCAT14(cStack_164,
                                                                                  CONCAT13(
                                                  uStack_165,
                                                  CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)
                                                          )))))) != 0x7274736668737570) {
                                            if (lVar3 == 0x70746573776172) {
                                              iVar7 = getindex_aux(L,L1,&local_170);
                                              iVar4 = getnum_aux(L,L1,&local_170);
                                              lua_rawsetp(L1,iVar7,(void *)(long)iVar4);
                                            }
                                            else if (lVar3 == 0x70746567776172) {
                                              iVar7 = getindex_aux(L,L1,&local_170);
                                              iVar4 = getnum_aux(L,L1,&local_170);
                                              lua_rawgetp(L1,iVar7,(void *)(long)iVar4);
                                            }
                                            else {
                                              if (lVar3 != 0x69746567776172) {
                                                if (CONCAT13(uStack_162,
                                                             CONCAT12(uStack_163,
                                                                      CONCAT11(cStack_164,uStack_165
                                                                              ))) == 0x65766f &&
                                                    CONCAT13(uStack_165,
                                                             CONCAT12(uStack_166,
                                                                      CONCAT11(cStack_167,local_168)
                                                                     )) == 0x6f6d6572) {
                                                  iVar7 = getnum_aux(L,L1,&local_170);
                                                  lua_rotate(L1,iVar7,-1);
                                                }
                                                else {
                                                  if (lVar3 != 0x6563616c706572) {
                                                    if (CONCAT13(uStack_162,
                                                                 CONCAT12(uStack_163,
                                                                          CONCAT11(cStack_164,
                                                                                   uStack_165))) ==
                                                        0x656d75 &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x75736572) {
                                                      iVar7 = getindex_aux(L,L1,&local_170);
                                                      plVar14 = lua_tothread(L1,iVar7);
                                                      iVar7 = getnum_aux(L,L1,&local_170);
                                                      local_174 = lua_resume(plVar14,L,iVar7);
                                                    }
                                                    else {
                                                      if (CONCAT13(uStack_162,
                                                                   CONCAT12(uStack_163,
                                                                            CONCAT11(cStack_164,
                                                                                     uStack_165)))
                                                          == 0x6e7275 &&
                                                          CONCAT13(uStack_165,
                                                                   CONCAT12(uStack_166,
                                                                            CONCAT11(cStack_167,
                                                                                     local_168))) ==
                                                          0x75746572) {
                                                        iVar7 = getnum_aux(L,L1,&local_170);
                                                        if (iVar7 < 1 || L1 == L) {
                                                          return iVar7;
                                                        }
                                                        iVar4 = -iVar7;
                                                        do {
                                                          pcVar13 = lua_tolstring(L1,iVar4,(size_t *
                                                  )0x0);
                                                  lua_pushstring(L,pcVar13);
                                                  iVar4 = iVar4 + 1;
                                                  } while (iVar4 != 0);
                                                  return iVar7;
                                                  }
                                                  if (CONCAT13(uStack_162,
                                                               CONCAT12(uStack_163,
                                                                        CONCAT11(cStack_164,
                                                                                 uStack_165))) ==
                                                      0x657461 &&
                                                      CONCAT13(uStack_165,
                                                               CONCAT12(uStack_166,
                                                                        CONCAT11(cStack_167,
                                                                                 local_168))) ==
                                                      0x61746f72) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    iVar4 = getnum_aux(L,L1,&local_170);
                                                    lua_rotate(L1,iVar7,iVar4);
                                                  }
                                                  else if (local_160 == '\0' &&
                                                           CONCAT17(uStack_161,
                                                                    CONCAT16(uStack_162,
                                                                             CONCAT15(uStack_163,
                                                                                      CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x646c656966746573) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    getstring_aux(L,&local_168,&local_170);
                                                    lua_setfield(L1,iVar7,&local_168);
                                                  }
                                                  else if (CONCAT11(uStack_15f,local_160) == 0x6c &&
                                                           CONCAT17(uStack_161,
                                                                    CONCAT16(uStack_162,
                                                                             CONCAT15(uStack_163,
                                                                                      CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x61626f6c67746573) {
                                                    getstring_aux(L,&local_168,&local_170);
                                                    lua_setglobal(L1,&local_168);
                                                  }
                                                  else if (lVar3 == 0x6b6f6f68746573) {
                                                    iVar7 = getnum_aux(L,L1,&local_170);
                                                    iVar4 = getnum_aux(L,L1,&local_170);
                                                    getstring_aux(L,&local_168,&local_170);
                                                    sethookaux(L1,iVar7,iVar4,&local_168);
                                                  }
                                                  else if (CONCAT17((undefined1)uStack_15c,
                                                                    CONCAT16(uStack_15d,
                                                                             CONCAT15(uStack_15e,
                                                                                      CONCAT14(
                                                  uStack_15f,
                                                  CONCAT13(local_160,
                                                           CONCAT12(uStack_161,
                                                                    CONCAT11(uStack_162,uStack_163))
                                                          ))))) == 0x656c6261746174 &&
                                                  CONCAT17(uStack_161,
                                                           CONCAT16(uStack_162,
                                                                    CONCAT15(uStack_163,
                                                                             CONCAT14(cStack_164,
                                                                                      CONCAT13(
                                                  uStack_165,
                                                  CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)
                                                          )))))) == 0x746174656d746573) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    lua_setmetatable(L1,iVar7);
                                                  }
                                                  else if (local_160 == '\0' &&
                                                           CONCAT17(uStack_161,
                                                                    CONCAT16(uStack_162,
                                                                             CONCAT15(uStack_163,
                                                                                      CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x656c626174746573) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    lua_settable(L1,iVar7);
                                                  }
                                                  else {
                                                    if (CONCAT13(uStack_162,
                                                                 CONCAT12(uStack_163,
                                                                          CONCAT11(cStack_164,
                                                                                   uStack_165))) ==
                                                        0x706f74 &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x74746573) {
                                                      uVar6 = getnum_aux(L,L1,&local_170);
                                                      goto LAB_0014ee75;
                                                    }
                                                    if (CONCAT11(uStack_15f,local_160) == 0x61 &&
                                                        CONCAT17(uStack_161,
                                                                 CONCAT16(uStack_162,
                                                                          CONCAT15(uStack_163,
                                                                                   CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x7461647574736574) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    getstring_aux(L,&local_168,&local_170);
                                                    pvVar11 = luaL_testudata(L1,iVar7,&local_168);
                                                    uVar6 = (uint)(pvVar11 != (void *)0x0);
LAB_0014e4e7:
                                                    lua_pushboolean(L1,uVar6);
                                                  }
                                                  else if (CONCAT11(uStack_163,cStack_164) == 0x72
                                                           && CONCAT13(uStack_165,
                                                                       CONCAT12(uStack_166,
                                                                                CONCAT11(cStack_167,
                                                                                         local_168))
                                                                      ) == 0x6f727265) {
                                                    lua_error(L1);
                                                  }
                                                  else {
                                                    if (CONCAT11(uStack_163,cStack_164) == 0x74 &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x726f6261) {
                                                      abort();
                                                    }
                                                    if (CONCAT11(uStack_163,cStack_164) == 0x77 &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x6f726874) {
                                                      luaL_error(L1,"C++");
                                                      return 0;
                                                    }
                                                    if (CONCAT13(uStack_162,
                                                                 CONCAT12(uStack_163,
                                                                          CONCAT11(cStack_164,
                                                                                   uStack_165))) ==
                                                        0x6c6f6f &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x6f626f74) {
                                                      iVar7 = getindex_aux(L,L1,&local_170);
                                                      uVar6 = lua_toboolean(L1,iVar7);
                                                      goto LAB_0014e4e7;
                                                    }
                                                    if (CONCAT13(uStack_15d,
                                                                 CONCAT12(uStack_15e,
                                                                          CONCAT11(uStack_15f,
                                                                                   local_160))) ==
                                                        0x6e6f69 &&
                                                        CONCAT17(uStack_161,
                                                                 CONCAT16(uStack_162,
                                                                          CONCAT15(uStack_163,
                                                                                   CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x74636e7566636f74) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    pcVar15 = lua_tocfunction(L1,iVar7);
                                                    iVar7 = 0;
                                                    goto LAB_0014f081;
                                                  }
                                                  if (CONCAT11(uStack_15f,local_160) == 0x72 &&
                                                      CONCAT17(uStack_161,
                                                               CONCAT16(uStack_162,
                                                                        CONCAT15(uStack_163,
                                                                                 CONCAT14(cStack_164
                                                                                          ,CONCAT13(
                                                  uStack_165,
                                                  CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)
                                                          )))))) == 0x656765746e696f74) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    sVar9 = lua_tointegerx(L1,iVar7,(int *)0x0);
                                                    goto LAB_0014ed58;
                                                  }
                                                  if (local_160 == '\0' &&
                                                      CONCAT17(uStack_161,
                                                               CONCAT16(uStack_162,
                                                                        CONCAT15(uStack_163,
                                                                                 CONCAT14(cStack_164
                                                                                          ,CONCAT13(
                                                  uStack_165,
                                                  CONCAT12(uStack_166,CONCAT11(cStack_167,local_168)
                                                          )))))) == 0x7265626d756e6f74) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    in_ZMM0._0_8_ =
                                                         lua_tonumberx(L1,iVar7,(int *)0x0);
                                                    in_ZMM0._8_56_ = extraout_var;
                                                  }
                                                  else {
                                                    if (CONCAT11(uStack_15f,local_160) != 0x72 ||
                                                        CONCAT17(uStack_161,
                                                                 CONCAT16(uStack_162,
                                                                          CONCAT15(uStack_163,
                                                                                   CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) != 0x65746e696f706f74) {
                                                    if (local_160 == '\0' &&
                                                        CONCAT17(uStack_161,
                                                                 CONCAT16(uStack_162,
                                                                          CONCAT15(uStack_163,
                                                                                   CONCAT14(
                                                  cStack_164,
                                                  CONCAT13(uStack_165,
                                                           CONCAT12(uStack_166,
                                                                    CONCAT11(cStack_167,local_168)))
                                                  )))) == 0x676e697274736f74) {
                                                    iVar7 = getindex_aux(L,L1,&local_170);
                                                    pcVar13 = lua_tolstring(L1,iVar7,(size_t *)0x0);
                                                    pcVar12 = lua_pushstring(L1,pcVar13);
                                                    if ((pcVar13 != (char *)0x0 ||
                                                         pcVar12 != (char *)0x0) &&
                                                       (iVar7 = strcmp(pcVar13,pcVar12), iVar7 != 0)
                                                       ) {
                                                      __assert_fail("0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                                                  ,0x5f3,
                                                  "int runC(lua_State *, lua_State *, const char *)"
                                                  );
                                                  }
                                                  }
                                                  else {
                                                    if (cStack_164 == '\0' &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x65707974) {
                                                      iVar7 = getnum_aux(L,L1,&local_170);
                                                      iVar7 = lua_type(L1,iVar7);
                                                      pcVar13 = lua_typename(L1,iVar7);
                                                      goto LAB_0014f288;
                                                    }
                                                    if (CONCAT11(uStack_163,cStack_164) == 0x65 &&
                                                        CONCAT13(uStack_165,
                                                                 CONCAT12(uStack_166,
                                                                          CONCAT11(cStack_167,
                                                                                   local_168))) ==
                                                        0x766f6d78) {
                                                      iVar7 = getindex_aux(L,L1,&local_170);
                                                      iVar4 = getindex_aux(L,L1,&local_170);
                                                      plVar14 = L1;
                                                      if (iVar7 != 0) {
                                                        plVar14 = lua_tothread(L1,iVar7);
                                                      }
                                                      to = L1;
                                                      if (iVar4 != 0) {
                                                        to = lua_tothread(L1,iVar4);
                                                      }
                                                      iVar7 = getnum_aux(L,L1,&local_170);
                                                      if (iVar7 == 0) {
                                                        iVar7 = lua_gettop(plVar14);
                                                      }
                                                      lua_xmove(plVar14,to,iVar7);
                                                    }
                                                    else {
                                                      if (CONCAT11(uStack_163,cStack_164) == 100 &&
                                                          CONCAT13(uStack_165,
                                                                   CONCAT12(uStack_166,
                                                                            CONCAT11(cStack_167,
                                                                                     local_168))) ==
                                                          0x6c656979) {
                                                        iVar7 = getnum_aux(L,L1,&local_170);
                                                        lVar16 = 0;
                                                        pcVar15 = (lua_KFunction)0x0;
LAB_0014fb30:
                                                        iVar7 = lua_yieldk(L1,iVar7,lVar16,pcVar15);
                                                        return iVar7;
                                                      }
                                                      if (CONCAT13(uStack_162,
                                                                   CONCAT12(uStack_163,
                                                                            CONCAT11(cStack_164,
                                                                                     uStack_165)))
                                                          == 0x6b646c &&
                                                          CONCAT13(uStack_165,
                                                                   CONCAT12(uStack_166,
                                                                            CONCAT11(cStack_167,
                                                                                     local_168))) ==
                                                          0x6c656979) {
                                                        iVar7 = getnum_aux(L,L1,&local_170);
                                                        iVar4 = getindex_aux(L,L1,&local_170);
                                                        lVar16 = (lua_KContext)iVar4;
                                                        pcVar15 = Cfunck;
                                                        goto LAB_0014fb30;
                                                      }
                                                      luaL_error(L,"unknown instruction %s",
                                                                 &local_168);
                                                    }
                                                  }
                                                  goto LAB_0014e8bb;
                                                  }
                                                  iVar7 = getindex_aux(L,L1,&local_170);
                                                  pvVar11 = lua_topointer(L1,iVar7);
                                                  auVar18 = vcvtusi2sd_avx512f(auVar18,pvVar11);
                                                  in_ZMM0 = ZEXT1664(auVar18);
                                                  }
LAB_0014f0aa:
                                                  lua_pushnumber(L1,in_ZMM0._0_8_);
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0014e8bb;
                                                  }
                                                  iVar7 = getindex_aux(L,L1,&local_170);
                                                  lua_copy(L1,-1,iVar7);
                                                }
LAB_0014f022:
                                                uVar6 = 0xfffffffe;
                                                goto LAB_0014ee75;
                                              }
                                              iVar7 = getindex_aux(L,L1,&local_170);
                                              iVar4 = getnum_aux(L,L1,&local_170);
                                              lua_rawgeti(L1,iVar7,(long)iVar4);
                                            }
                                            goto LAB_0014e8bb;
                                          }
                                          pcVar13 = lua_tolstring(L,-2,(size_t *)0x0);
                                          pcVar12 = (char *)lua_topointer(L,-1);
                                        }
                                        lua_pushfstring(L1,pcVar13,pcVar12);
                                      }
                                      goto LAB_0014e8bb;
                                    }
                                    getstring_aux(L,&local_168,&local_170);
                                    pcVar13 = &local_168;
                                  }
LAB_0014f288:
                                  lua_pushstring(L1,pcVar13);
                                }
                              }
                              goto LAB_0014e8bb;
                            }
                            iVar5 = getnum_aux(L,L1,&local_170);
                            iVar4 = getnum_aux(L,L1,&local_170);
                            iVar7 = getindex_aux(L,L1,&local_170);
                            lVar16 = (lua_KContext)iVar7;
                            iVar7 = 0;
                            pcVar15 = Cfunck;
                          }
                          local_174 = lua_pcallk(L1,iVar5,iVar4,iVar7,lVar16,pcVar15);
                        }
                      }
                      goto LAB_0014e8bb;
                    }
                    iVar7 = getindex_aux(L,L1,&local_170);
                    iVar7 = lua_type(L1,iVar7);
                    bVar17 = iVar7 == 2;
                  }
                  goto LAB_0014eaf1;
                }
                iVar7 = getindex_aux(L,L1,&local_170);
                uVar6 = lua_isstring(L1,iVar7);
              }
            }
LAB_0014eaf8:
            lua_pushboolean(L1,uVar6);
          }
        }
      }
LAB_0014e8bb:
      getstring_aux(L,&local_168,&local_170);
    } while (local_168 != '\0');
  }
  return 0;
}

Assistant:

static int runC (lua_State *L, lua_State *L1, const char *pc) {
  char buff[300];
  int status = 0;
  if (pc == NULL) return luaL_error(L, "attempt to runC null script");
  for (;;) {
    const char *inst = getstring;
    if EQ("") return 0;
    else if EQ("absindex") {
      lua_pushnumber(L1, lua_absindex(L1, getindex));
    }
    else if EQ("append") {
      int t = getindex;
      int i = lua_rawlen(L1, t);
      lua_rawseti(L1, t, i + 1);
    }
    else if EQ("arith") {
      int op;
      skip(&pc);
      op = strchr(ops, *pc++) - ops;
      lua_arith(L1, op);
    }
    else if EQ("call") {
      int narg = getnum;
      int nres = getnum;
      lua_call(L1, narg, nres);
    }
    else if EQ("callk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      lua_callk(L1, narg, nres, i, Cfunck);
    }
    else if EQ("checkstack") {
      int sz = getnum;
      const char *msg = getstring;
      if (*msg == '\0')
        msg = NULL;  /* to test 'luaL_checkstack' with no message */
      luaL_checkstack(L1, sz, msg);
    }
    else if EQ("compare") {
      const char *opt = getstring;  /* EQ, LT, or LE */
      int op = (opt[0] == 'E') ? LUA_OPEQ
                               : (opt[1] == 'T') ? LUA_OPLT : LUA_OPLE;
      int a = getindex;
      int b = getindex;
      lua_pushboolean(L1, lua_compare(L1, a, b, op));
    }
    else if EQ("concat") {
      lua_concat(L1, getnum);
    }
    else if EQ("copy") {
      int f = getindex;
      lua_copy(L1, f, getindex);
    }
    else if EQ("func2num") {
      lua_CFunction func = lua_tocfunction(L1, getindex);
      lua_pushnumber(L1, cast(size_t, func));
    }
    else if EQ("getfield") {
      int t = getindex;
      lua_getfield(L1, t, getstring);
    }
    else if EQ("getglobal") {
      lua_getglobal(L1, getstring);
    }
    else if EQ("getmetatable") {
      if (lua_getmetatable(L1, getindex) == 0)
        lua_pushnil(L1);
    }
    else if EQ("gettable") {
      lua_gettable(L1, getindex);
    }
    else if EQ("gettop") {
      lua_pushinteger(L1, lua_gettop(L1));
    }
    else if EQ("gsub") {
      int a = getnum; int b = getnum; int c = getnum;
      luaL_gsub(L1, lua_tostring(L1, a),
                    lua_tostring(L1, b),
                    lua_tostring(L1, c));
    }
    else if EQ("insert") {
      lua_insert(L1, getnum);
    }
    else if EQ("iscfunction") {
      lua_pushboolean(L1, lua_iscfunction(L1, getindex));
    }
    else if EQ("isfunction") {
      lua_pushboolean(L1, lua_isfunction(L1, getindex));
    }
    else if EQ("isnil") {
      lua_pushboolean(L1, lua_isnil(L1, getindex));
    }
    else if EQ("isnull") {
      lua_pushboolean(L1, lua_isnone(L1, getindex));
    }
    else if EQ("isnumber") {
      lua_pushboolean(L1, lua_isnumber(L1, getindex));
    }
    else if EQ("isstring") {
      lua_pushboolean(L1, lua_isstring(L1, getindex));
    }
    else if EQ("istable") {
      lua_pushboolean(L1, lua_istable(L1, getindex));
    }
    else if EQ("isudataval") {
      lua_pushboolean(L1, lua_islightuserdata(L1, getindex));
    }
    else if EQ("isuserdata") {
      lua_pushboolean(L1, lua_isuserdata(L1, getindex));
    }
    else if EQ("len") {
      lua_len(L1, getindex);
    }
    else if EQ("Llen") {
      lua_pushinteger(L1, luaL_len(L1, getindex));
    }
    else if EQ("loadfile") {
      luaL_loadfile(L1, luaL_checkstring(L1, getnum));
    }
    else if EQ("loadstring") {
      const char *s = luaL_checkstring(L1, getnum);
      luaL_loadstring(L1, s);
    }
    else if EQ("newmetatable") {
      lua_pushboolean(L1, luaL_newmetatable(L1, getstring));
    }
    else if EQ("newtable") {
      lua_newtable(L1);
    }
    else if EQ("newthread") {
      lua_newthread(L1);
    }
    else if EQ("newuserdata") {
      lua_newuserdata(L1, getnum);
    }
    else if EQ("next") {
      lua_next(L1, -2);
    }
    else if EQ("objsize") {
      lua_pushinteger(L1, lua_rawlen(L1, getindex));
    }
    else if EQ("pcall") {
      int narg = getnum;
      int nres = getnum;
      status = lua_pcall(L1, narg, nres, getnum);
    }
    else if EQ("pcallk") {
      int narg = getnum;
      int nres = getnum;
      int i = getindex;
      status = lua_pcallk(L1, narg, nres, 0, i, Cfunck);
    }
    else if EQ("pop") {
      lua_pop(L1, getnum);
    }
    else if EQ("printstack") {
      int n = getnum;
      if (n != 0) {
        printf("%s\n", luaL_tolstring(L1, n, NULL));
        lua_pop(L1, 1);
      }
      else printstack(L1);
    }
    else if EQ("print") {
      const char *msg = getstring;
      printf("%s\n", msg);
    }

    else if EQ("pushbool") {
      lua_pushboolean(L1, getnum);
    }
    else if EQ("pushcclosure") {
      lua_pushcclosure(L1, testC, getnum);
    }
    else if EQ("pushint") {
      lua_pushinteger(L1, getnum);
    }
    else if EQ("pushnil") {
      lua_pushnil(L1);
    }
    else if EQ("pushnum") {
      lua_pushnumber(L1, (lua_Number)getnum);
    }
    else if EQ("pushstatus") {
      pushcode(L1, status);
    }
    else if EQ("pushstring") {
      lua_pushstring(L1, getstring);
    }
    else if EQ("pushupvalueindex") {
      lua_pushinteger(L1, lua_upvalueindex(getnum));
    }
    else if EQ("pushvalue") {
      lua_pushvalue(L1, getindex);
    }
    else if EQ("pushfstringI") {
      lua_pushfstring(L1, lua_tostring(L, -2), (int)lua_tointeger(L, -1));
    }
    else if EQ("pushfstringS") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_tostring(L, -1));
    }
    else if EQ("pushfstringP") {
      lua_pushfstring(L1, lua_tostring(L, -2), lua_topointer(L, -1));
    }
    else if EQ("rawgeti") {
      int t = getindex;
      lua_rawgeti(L1, t, getnum);
    }
    else if EQ("rawgetp") {
      int t = getindex;
      lua_rawgetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("rawsetp") {
      int t = getindex;
      lua_rawsetp(L1, t, cast(void *, cast(size_t, getnum)));
    }
    else if EQ("remove") {
      lua_remove(L1, getnum);
    }
    else if EQ("replace") {
      lua_replace(L1, getindex);
    }
    else if EQ("resume") {
      int i = getindex;
      status = lua_resume(lua_tothread(L1, i), L, getnum);
    }
    else if EQ("return") {
      int n = getnum;
      if (L1 != L) {
        int i;
        for (i = 0; i < n; i++)
          lua_pushstring(L, lua_tostring(L1, -(n - i)));
      }
      return n;
    }
    else if EQ("rotate") {
      int i = getindex;
      lua_rotate(L1, i, getnum);
    }
    else if EQ("setfield") {
      int t = getindex;
      lua_setfield(L1, t, getstring);
    }
    else if EQ("setglobal") {
      lua_setglobal(L1, getstring);
    }
    else if EQ("sethook") {
      int mask = getnum;
      int count = getnum;
      sethookaux(L1, mask, count, getstring);
    }
    else if EQ("setmetatable") {
      lua_setmetatable(L1, getindex);
    }
    else if EQ("settable") {
      lua_settable(L1, getindex);
    }
    else if EQ("settop") {
      lua_settop(L1, getnum);
    }
    else if EQ("testudata") {
      int i = getindex;
      lua_pushboolean(L1, luaL_testudata(L1, i, getstring) != NULL);
    }
    else if EQ("error") {
      lua_error(L1);
    }
    else if EQ("abort") {
      abort();
    }
    else if EQ("throw") {
#if defined(__cplusplus)
static struct X { int x; } x;
      throw x;
#else
      luaL_error(L1, "C++");
#endif
      break;
    }
    else if EQ("tobool") {
      lua_pushboolean(L1, lua_toboolean(L1, getindex));
    }
    else if EQ("tocfunction") {
      lua_pushcfunction(L1, lua_tocfunction(L1, getindex));
    }
    else if EQ("tointeger") {
      lua_pushinteger(L1, lua_tointeger(L1, getindex));
    }
    else if EQ("tonumber") {
      lua_pushnumber(L1, lua_tonumber(L1, getindex));
    }
    else if EQ("topointer") {
      lua_pushnumber(L1, cast(size_t, lua_topointer(L1, getindex)));
    }
    else if EQ("tostring") {
      const char *s = lua_tostring(L1, getindex);
      const char *s1 = lua_pushstring(L1, s);
      lua_longassert((s == NULL && s1 == NULL) || strcmp(s, s1) == 0);
    }
    else if EQ("type") {
      lua_pushstring(L1, luaL_typename(L1, getnum));
    }
    else if EQ("xmove") {
      int f = getindex;
      int t = getindex;
      lua_State *fs = (f == 0) ? L1 : lua_tothread(L1, f);
      lua_State *ts = (t == 0) ? L1 : lua_tothread(L1, t);
      int n = getnum;
      if (n == 0) n = lua_gettop(fs);
      lua_xmove(fs, ts, n);
    }
    else if EQ("yield") {
      return lua_yield(L1, getnum);
    }
    else if EQ("yieldk") {
      int nres = getnum;
      int i = getindex;
      return lua_yieldk(L1, nres, i, Cfunck);
    }
    else luaL_error(L, "unknown instruction %s", buff);
  }
  return 0;
}